

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writefile.cpp
# Opt level: O0

void __thiscall WriteFile::Append(WriteFile *this,char *data,size_t writeSize)

{
  unsigned_long *puVar1;
  unsigned_long local_30;
  size_t local_28;
  size_t nCanWrited;
  size_t writeSize_local;
  char *data_local;
  WriteFile *this_local;
  
  local_30 = 0x10000 - this->m_pos;
  nCanWrited = writeSize;
  writeSize_local = (size_t)data;
  data_local = (char *)this;
  puVar1 = std::min<unsigned_long>(&nCanWrited,&local_30);
  local_28 = *puVar1;
  memcpy(this->m_buff + this->m_pos,(void *)writeSize_local,local_28);
  nCanWrited = nCanWrited - local_28;
  writeSize_local = local_28 + writeSize_local;
  this->m_pos = local_28 + this->m_pos;
  if (nCanWrited != 0) {
    Flush(this);
    if (nCanWrited < 0x10000) {
      memcpy(this->m_buff,(void *)writeSize_local,nCanWrited);
      this->m_pos = nCanWrited;
    }
    else {
      WriteUnbuffered(this,(char *)writeSize_local,nCanWrited);
    }
  }
  return;
}

Assistant:

void WriteFile::Append(const char * data, size_t writeSize)
{
	// feed as much as possible into the buffer
	size_t nCanWrited = std::min(writeSize, (kWriteFileBufferSize - m_pos));
	memcpy(m_buff + m_pos, data, nCanWrited);
	writeSize -= nCanWrited;
	data += nCanWrited;
	m_pos += nCanWrited;
	if (0 == writeSize)
	{
		return;
	}
	
	// can't feed all data into buffer, need to do write m_fd
	Flush();
	
	// rest data can be writed into m_buff, then write them into m_bufff, else do write m_fd directly
	if (writeSize < kWriteFileBufferSize)
	{
		memcpy(m_buff, data, writeSize);
		m_pos = writeSize;
		return;
	}
	
	WriteUnbuffered(data, writeSize);
}